

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O2

_Bool hashmap_iter(hashmap *map,size_t *i,void **item)

{
  ulong uVar1;
  void *pvVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  
  sVar3 = *i;
  do {
    uVar5 = sVar3;
    uVar1 = map->nbuckets;
    if (uVar1 <= uVar5) goto LAB_0010be0b;
    pvVar2 = map->buckets;
    lVar4 = map->bucketsz * uVar5;
    *i = uVar5 + 1;
    sVar3 = uVar5 + 1;
  } while (*(short *)((long)pvVar2 + lVar4 + 6) == 0);
  *item = (void *)((long)pvVar2 + lVar4 + 8);
LAB_0010be0b:
  return uVar5 < uVar1;
}

Assistant:

bool hashmap_iter(struct hashmap *map, size_t *i, void **item) {
    struct bucket *bucket;
    do {
        if (*i >= map->nbuckets) return false;
        bucket = bucket_at(map, *i);
        (*i)++;
    } while (!bucket->dib);
    *item = bucket_item(bucket);
    return true;
}